

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Scan.cpp
# Opt level: O1

bool __thiscall glslang::TInputScanner::consumeComment(TInputScanner *this)

{
  uint uVar1;
  int iVar2;
  long lVar3;
  ulong uVar4;
  size_t sVar5;
  
  lVar3 = (long)this->currentSource;
  if (this->currentSource < this->numSources) {
    sVar5 = this->currentChar;
    do {
      if (sVar5 < this->lengths[lVar3]) {
        if (this->sources[lVar3][sVar5] != '/') goto LAB_0043f79e;
        get(this);
        lVar3 = (long)this->currentSource;
        if (this->numSources <= this->currentSource) {
          this->endOfFileReached = true;
          goto LAB_0043f69a;
        }
        uVar4 = this->currentChar;
        goto LAB_0043f681;
      }
      lVar3 = lVar3 + 1;
      sVar5 = 0;
    } while (this->numSources != lVar3);
    goto LAB_0043f7a1;
  }
  this->endOfFileReached = true;
  goto LAB_0043f79e;
LAB_0043f74c:
  while ((iVar2 == 10 || (iVar2 == 0xd))) {
    iVar2 = get(this);
  }
  if (iVar2 != -1) {
    unget(this);
  }
  sVar5 = 1;
  goto LAB_0043f7a1;
  while( true ) {
    lVar3 = lVar3 + 1;
    uVar4 = 0;
    if (this->numSources == lVar3) break;
LAB_0043f681:
    if (uVar4 < this->lengths[lVar3]) {
      uVar1 = (uint)this->sources[lVar3][uVar4];
      goto LAB_0043f6ad;
    }
  }
LAB_0043f69a:
  uVar1 = 0xffffffff;
LAB_0043f6ad:
  if (uVar1 == 0x2a) {
    get(this);
    do {
      iVar2 = get(this);
      while (sVar5 = 1, iVar2 == 0x2a) {
        iVar2 = get(this);
        if (iVar2 == 0x2f) goto LAB_0043f7a1;
      }
    } while (iVar2 != -1);
    goto LAB_0043f7a1;
  }
  if (uVar1 == 0x2f) {
    get(this);
    iVar2 = get(this);
    do {
      if (iVar2 == 0x5c) {
        iVar2 = get(this);
        if (iVar2 == 0xd) {
          lVar3 = (long)this->currentSource;
          if (this->currentSource < this->numSources) {
            uVar4 = this->currentChar;
            do {
              if (uVar4 < this->lengths[lVar3]) {
                if (this->sources[lVar3][uVar4] == '\n') {
                  get(this);
                }
                break;
              }
              lVar3 = lVar3 + 1;
              uVar4 = 0;
            } while (this->numSources != lVar3);
          }
          else {
            this->endOfFileReached = true;
          }
        }
      }
      else if ((iVar2 + 1U < 0xf) && ((0x4801U >> (iVar2 + 1U & 0x1f) & 1) != 0)) goto LAB_0043f74c;
      iVar2 = get(this);
    } while( true );
  }
  unget(this);
LAB_0043f79e:
  sVar5 = 0;
LAB_0043f7a1:
  return SUB81(sVar5,0);
}

Assistant:

bool TInputScanner::consumeComment()
{
    if (peek() != '/')
        return false;

    get();  // consume the '/'
    int c = peek();
    if (c == '/') {

        // a '//' style comment
        get();  // consume the second '/'
        c = get();
        do {
            while (c != EndOfInput && c != '\\' && c != '\r' && c != '\n')
                c = get();

            if (c == EndOfInput || c == '\r' || c == '\n') {
                while (c == '\r' || c == '\n')
                    c = get();

                // we reached the end of the comment
                break;
            } else {
                // it's a '\', so we need to keep going, after skipping what's escaped

                // read the skipped character
                c = get();

                // if it's a two-character newline, skip both characters
                if (c == '\r' && peek() == '\n')
                    get();
                c = get();
            }
        } while (true);

        // put back the last non-comment character
        if (c != EndOfInput)
            unget();

        return true;
    } else if (c == '*') {

        // a '/*' style comment
        get();  // consume the '*'
        c = get();
        do {
            while (c != EndOfInput && c != '*')
                c = get();
            if (c == '*') {
                c = get();
                if (c == '/')
                    break;  // end of comment
                // not end of comment
            } else // end of input
                break;
        } while (true);

        return true;
    } else {
        // it's not a comment, put the '/' back
        unget();

        return false;
    }
}